

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall cxxopts::option_exists_error::~option_exists_error(option_exists_error *this)

{
  OptionException::~OptionException((OptionException *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

option_exists_error(const std::string& option)
    : OptionSpecException(u8"Option ‘" + option + u8"’ already exists")
    {
    }